

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::LRUCache::Unref(LRUCache *this,LRUHandle *e)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  _func_void_Slice_ptr_void_ptr *p_Var3;
  uint32_t uVar4;
  Slice local_20;
  
  if (e->refs == 0) {
    __assert_fail("e->refs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                  ,0xe3,"void leveldb::(anonymous namespace)::LRUCache::Unref(LRUHandle *)");
  }
  uVar4 = e->refs - 1;
  e->refs = uVar4;
  if (uVar4 == 0) {
    if (e->in_cache != false) {
      __assert_fail("!e->in_cache",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                    ,0xe6,"void leveldb::(anonymous namespace)::LRUCache::Unref(LRUHandle *)");
    }
    p_Var3 = e->deleter;
    local_20 = LRUHandle::key(e);
    (*p_Var3)(&local_20,e->value);
    free(e);
  }
  else if (uVar4 == 1 && e->in_cache == true) {
    pLVar1 = e->next;
    pLVar2 = e->prev;
    pLVar1->prev = pLVar2;
    pLVar2->next = pLVar1;
    e->next = &this->lru_;
    pLVar1 = (this->lru_).prev;
    e->prev = pLVar1;
    pLVar1->next = e;
    e->next->prev = e;
  }
  return;
}

Assistant:

void LRUCache::Unref(LRUHandle* e) {
  assert(e->refs > 0);
  e->refs--;
  if (e->refs == 0) {  // Deallocate.
    assert(!e->in_cache);
    (*e->deleter)(e->key(), e->value);
    free(e);
  } else if (e->in_cache && e->refs == 1) {
    // No longer in use; move to lru_ list.
    LRU_Remove(e);
    LRU_Append(&lru_, e);
  }
}